

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::detail::generic_type::mark_parents_nonsimple(generic_type *this,PyTypeObject *value)

{
  PyTypeObject *type;
  tuple_iterator tVar1;
  type_info *ptVar2;
  tuple *__range2;
  sequence_fast_readonly sVar3;
  tuple t;
  handle local_28;
  
  local_28.m_ptr = value->tp_bases;
  if (local_28.m_ptr != (PyObject *)0x0) {
    (local_28.m_ptr)->ob_refcnt = (local_28.m_ptr)->ob_refcnt + 1;
  }
  sVar3.ptr = (PyObject **)&local_28.m_ptr[1].ob_type;
  if (((local_28.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar3.ptr = (PyObject **)*sVar3.ptr;
  }
  tVar1 = tuple::end((tuple *)&local_28);
  for (; (sequence_fast_readonly)sVar3.ptr != tVar1.super_sequence_fast_readonly.ptr;
      sVar3.ptr = sVar3.ptr + 1) {
    type = (PyTypeObject *)*sVar3.ptr;
    ptVar2 = get_type_info(type);
    if (ptVar2 != (type_info *)0x0) {
      ptVar2->field_0x90 = ptVar2->field_0x90 & 0xfe;
    }
    mark_parents_nonsimple(this,type);
  }
  object::~object((object *)&local_28);
  return;
}

Assistant:

void mark_parents_nonsimple(PyTypeObject *value) {
        auto t = reinterpret_borrow<tuple>(value->tp_bases);
        for (handle h : t) {
            auto tinfo2 = get_type_info((PyTypeObject *) h.ptr());
            if (tinfo2)
                tinfo2->simple_type = false;
            mark_parents_nonsimple((PyTypeObject *) h.ptr());
        }
    }